

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_pa_stream *
ma_device__pa_stream_new__pulse
          (ma_device *pDevice,char *pStreamName,ma_pa_sample_spec *ss,ma_pa_channel_map *cmap)

{
  ma_pa_stream *pmVar1;
  char local_128 [8];
  char actualStreamName [256];
  ma_pa_channel_map *cmap_local;
  ma_pa_sample_spec *ss_local;
  char *pStreamName_local;
  ma_device *pDevice_local;
  
  actualStreamName._248_8_ = cmap;
  if (pStreamName == (char *)0x0) {
    ma_strcpy_s(local_128,0x100,"miniaudio:");
    ma_itoa_s(ma_device__pa_stream_new__pulse::g_StreamCounter,actualStreamName,0xf8,10);
  }
  else {
    ma_strncpy_s(local_128,0x100,pStreamName,0xffffffffffffffff);
  }
  ma_device__pa_stream_new__pulse::g_StreamCounter =
       ma_device__pa_stream_new__pulse::g_StreamCounter + 1;
  pmVar1 = (ma_pa_stream *)
           (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_get_buffer_size)
                     ((pDevice->field_23).pulse.pPulseContext,local_128,ss,actualStreamName._248_8_)
  ;
  return pmVar1;
}

Assistant:

static ma_pa_stream* ma_device__pa_stream_new__pulse(ma_device* pDevice, const char* pStreamName, const ma_pa_sample_spec* ss, const ma_pa_channel_map* cmap)
{
    static int g_StreamCounter = 0;
    char actualStreamName[256];

    if (pStreamName != NULL) {
        ma_strncpy_s(actualStreamName, sizeof(actualStreamName), pStreamName, (size_t)-1);
    } else {
        ma_strcpy_s(actualStreamName, sizeof(actualStreamName), "miniaudio:");
        ma_itoa_s(g_StreamCounter, actualStreamName + 8, sizeof(actualStreamName)-8, 10);  /* 8 = strlen("miniaudio:") */
    }
    g_StreamCounter += 1;

    return ((ma_pa_stream_new_proc)pDevice->pContext->pulse.pa_stream_new)((ma_pa_context*)pDevice->pulse.pPulseContext, actualStreamName, ss, cmap);
}